

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::AddCMakeDependFilesFromUser(cmMakefile *this)

{
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  pointer __x;
  string f;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  deps;
  string local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  undefined1 local_58 [40];
  
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (value_type *)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (value_type *)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"CMAKE_CONFIGURE_DEPENDS","");
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_58,&this->StateSnapshot);
  pcVar2 = cmStateDirectory::GetProperty((cmStateDirectory *)local_58,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (pcVar2 != (char *)0x0) {
    local_58._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)(local_58 + 0x10)
    ;
    sVar3 = strlen(pcVar2);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_58,pcVar2,pcVar2 + sVar3);
    cmSystemTools::ExpandListArgument((string *)local_58,&local_78,false);
    if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_58._0_8_ !=
        (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)(local_58 + 0x10)) {
      operator_delete((void *)local_58._0_8_,(ulong)(local_58._16_8_ + 1));
    }
  }
  if (local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __x = local_78.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    do {
      bVar1 = cmsys::SystemTools::FileIsFullPath((__x->_M_dataplus)._M_p);
      if (bVar1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->ListFiles,__x);
      }
      else {
        cmStateSnapshot::GetDirectory((cmStateDirectory *)local_58,&this->StateSnapshot);
        pcVar2 = cmStateDirectory::GetCurrentSource((cmStateDirectory *)local_58);
        std::__cxx11::string::string((string *)&local_98,pcVar2,(allocator *)local_58);
        std::__cxx11::string::append((char *)&local_98);
        std::__cxx11::string::_M_append((char *)&local_98,(ulong)(__x->_M_dataplus)._M_p);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->ListFiles,&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
      }
      __x = __x + 1;
    } while (__x != local_78.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  return;
}

Assistant:

void cmMakefile::AddCMakeDependFilesFromUser()
{
  std::vector<std::string> deps;
  if (const char* deps_str = this->GetProperty("CMAKE_CONFIGURE_DEPENDS")) {
    cmSystemTools::ExpandListArgument(deps_str, deps);
  }
  for (std::vector<std::string>::iterator i = deps.begin(); i != deps.end();
       ++i) {
    if (cmSystemTools::FileIsFullPath(i->c_str())) {
      this->AddCMakeDependFile(*i);
    } else {
      std::string f = this->GetCurrentSourceDirectory();
      f += "/";
      f += *i;
      this->AddCMakeDependFile(f);
    }
  }
}